

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<std::_Rb_tree_const_iterator<Node<Read>_>_>::copyAppend
          (QGenericArrayOps<std::_Rb_tree_const_iterator<Node<Read>_>_> *this,
          _Rb_tree_const_iterator<Node<Read>_> *b,_Rb_tree_const_iterator<Node<Read>_> *e)

{
  _Rb_tree_const_iterator<Node<Read>_> *p_Var1;
  long lVar2;
  
  if (b != e) {
    p_Var1 = (this->super_QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_>).ptr;
    lVar2 = (this->super_QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_>).size;
    for (; b < e; b = b + 1) {
      p_Var1[lVar2]._M_node = b->_M_node;
      (this->super_QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Read>_>_>).size = lVar2 + 1;
      lVar2 = lVar2 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }